

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O0

void __thiscall cnn::AlignedMemoryPool<6U>::zero_allocated_memory(AlignedMemoryPool<6U> *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    memset(*(void **)(in_RDI + 0x18),0,*(size_t *)(in_RDI + 8));
  }
  return;
}

Assistant:

void zero_allocated_memory() {
    if (used == 0) return;
#if HAVE_CUDA
    CUDA_CHECK(cudaMemsetAsync(mem, 0, used));
#else
    std::memset(mem, 0, used);
#endif
  }